

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.h
# Opt level: O2

void __thiscall
mjs::not_callable_exception::not_callable_exception(not_callable_exception *this,value *v)

{
  value *in_RDX;
  string local_30;
  
  format_error_message_abi_cxx11_(&local_30,(not_callable_exception *)v,in_RDX);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)this = &PTR__runtime_error_001c2a70;
  return;
}

Assistant:

explicit not_callable_exception(const value& v) : std::runtime_error(format_error_message(v)) {
    }